

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

ll_node * ll_from_array(void *ptr,size_t isize,size_t n)

{
  ll_node *plVar1;
  undefined4 local_4c;
  void *pvStack_48;
  int i;
  void *item_ptr;
  ll_node *cur_node;
  ll_node *prev_node;
  ll_node *root_node;
  size_t n_local;
  size_t isize_local;
  void *ptr_local;
  
  prev_node = (ll_node *)0x0;
  item_ptr = (void *)0x0;
  if (((n == 0) || (isize == 0)) || (ptr == (void *)0x0)) {
    ptr_local = (void *)0x0;
  }
  else {
    pvStack_48 = ptr;
    for (local_4c = 0; (ulong)(long)local_4c < n; local_4c = local_4c + 1) {
      if (item_ptr == (void *)0x0) {
        prev_node = ll_create_node(pvStack_48,isize);
        plVar1 = prev_node;
      }
      else {
        plVar1 = ll_create_node(pvStack_48,isize);
        if (item_ptr != (void *)0x0) {
          *(ll_node **)((long)item_ptr + 0x10) = plVar1;
        }
      }
      item_ptr = plVar1;
      pvStack_48 = (void *)(isize + (long)pvStack_48);
    }
    ptr_local = prev_node;
  }
  return (ll_node *)ptr_local;
}

Assistant:

struct ll_node *ll_from_array(const void *ptr, size_t isize, size_t n)
{
	struct ll_node *root_node = NULL;
	struct ll_node *prev_node = NULL;
	struct ll_node *cur_node = NULL;
	void *item_ptr = (void *)ptr;
	int i;
	if (n <= 0 || isize <= 0 || ptr == NULL) {
		return NULL;
	}
	for (i = 0; i < n; i++) {
		if (cur_node == NULL) {
			cur_node = ll_create_node(item_ptr, isize);
			root_node = cur_node;
		} else {
			prev_node = cur_node;
			cur_node = ll_create_node(item_ptr, isize);
			if (prev_node != NULL) {
				prev_node->next = cur_node;
			}
		}
		item_ptr += isize;
	}
	return root_node;
}